

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void fmt::v5::internal::
     handle_cstring_type_spec<char,fmt::v5::internal::arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::cstring_spec_handler>
               (char spec,cstring_spec_handler *handler)

{
  undefined4 uVar1;
  format_specs *pfVar2;
  undefined3 uVar3;
  format_error *this;
  size_t in_RCX;
  void *in_RDX;
  int iVar4;
  undefined7 in_register_00000039;
  basic_format_specs<char> local_28;
  
  iVar4 = (int)CONCAT71(in_register_00000039,spec);
  if (iVar4 != 0x73) {
    if (iVar4 == 0x70) {
      pfVar2 = handler->formatter->specs_;
      local_28.super_align_spec.width_ = (pfVar2->super_align_spec).width_;
      local_28.super_align_spec.fill_ = (pfVar2->super_align_spec).fill_;
      uVar1 = pfVar2->precision_;
      uVar3 = *(undefined3 *)&pfVar2->field_0x15;
      local_28.super_align_spec.align_ =
           (alignment)*(undefined8 *)&(pfVar2->super_align_spec).align_;
      local_28.flags_ = 8;
      local_28.type_ = 'x';
      local_28.precision_ = uVar1;
      local_28._21_3_ = uVar3;
      basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
      write_int<unsigned_long,fmt::v5::basic_format_specs<char>>
                ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
                 handler->formatter,(unsigned_long)handler->value,&local_28);
      return;
    }
    if (iVar4 != 0) {
      this = (format_error *)__cxa_allocate_exception(0x10);
      format_error::format_error(this,"invalid type specifier");
      __cxa_throw(this,&format_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
            (handler->formatter,(int)handler->value,in_RDX,in_RCX);
  return;
}

Assistant:

FMT_CONSTEXPR void handle_cstring_type_spec(Char spec, Handler &&handler) {
  if (spec == 0 || spec == 's')
    handler.on_string();
  else if (spec == 'p')
    handler.on_pointer();
  else
    handler.on_error("invalid type specifier");
}